

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O0

BOOL __thiscall
Js::TypedArray<float,_false,_false>::DirectSetItemNoSet
          (TypedArray<float,_false,_false> *this,uint32 index,Var value)

{
  BOOL BVar1;
  Var value_local;
  uint32 index_local;
  TypedArray<float,_false,_false> *this_local;
  
  BVar1 = BaseTypedDirectSetItemNoSet(this,index,value,JavascriptConversion::ToFloat);
  return BVar1;
}

Assistant:

inline BOOL Float32Array::DirectSetItemNoSet(__in uint32 index, __in Js::Var value)
    {
        return BaseTypedDirectSetItemNoSet(index, value, JavascriptConversion::ToFloat);
    }